

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilClearTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::anon_unknown_1::Clear::Clear(Clear *this)

{
  Clear *this_local;
  
  this->clearMask = 0;
  this->clearDepth = 0.0;
  this->clearStencil = 0;
  this->useScissor = false;
  tcu::Vector<int,_4>::Vector(&this->scissor,0,0,0,0);
  this->depthMask = false;
  this->stencilMask = 0;
  return;
}

Assistant:

Clear (void)
		: clearMask			(0)
		, clearDepth		(0.0f)
		, clearStencil		(0)
		, useScissor		(false)
		, scissor			(0, 0, 0, 0)
		, depthMask			(false)
		, stencilMask		(0)
	{
	}